

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

int Sfm_LibImplementSimple
              (Sfm_Lib_t *p,word *pTruth,int *pFanins,int nFanins,Vec_Int_t *vGates,
              Vec_Wec_t *vFanins)

{
  int iVar1;
  Mio_Library_t *pLib_00;
  Vec_Int_t *p_00;
  Mio_Gate_t *local_70;
  Mio_Gate_t *local_60;
  Vec_Int_t *vLevel;
  Mio_Gate_t *pGate;
  Mio_Library_t *pLib;
  Vec_Wec_t *vFanins_local;
  Vec_Int_t *vGates_local;
  int nFanins_local;
  int *pFanins_local;
  word *pTruth_local;
  Sfm_Lib_t *p_local;
  
  pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
  iVar1 = Abc_TtIsConst0(pTruth,p->nWords);
  if ((iVar1 != 0) || (iVar1 = Abc_TtIsConst1(pTruth,p->nWords), iVar1 != 0)) {
    if (nFanins == 0) {
      iVar1 = Abc_TtIsConst1(pTruth,p->nWords);
      if (iVar1 == 0) {
        local_60 = Mio_LibraryReadConst0(pLib_00);
      }
      else {
        local_60 = Mio_LibraryReadConst1(pLib_00);
      }
      iVar1 = Mio_GateReadValue(local_60);
      Vec_IntPush(vGates,iVar1);
      Vec_WecPushLevel(vFanins);
      return 1;
    }
    __assert_fail("nFanins == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                  ,0x2ae,
                  "int Sfm_LibImplementSimple(Sfm_Lib_t *, word *, int *, int, Vec_Int_t *, Vec_Wec_t *)"
                 );
  }
  iVar1 = Abc_TtEqual(pTruth,s_Truth8[0],p->nWords);
  if ((iVar1 == 0) && (iVar1 = Abc_TtOpposite(pTruth,s_Truth8[0],p->nWords), iVar1 == 0)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                  ,0x2bd,
                  "int Sfm_LibImplementSimple(Sfm_Lib_t *, word *, int *, int, Vec_Int_t *, Vec_Wec_t *)"
                 );
  }
  if (nFanins == 1) {
    iVar1 = Abc_TtEqual(pTruth,s_Truth8[0],p->nWords);
    if (iVar1 == 0) {
      local_70 = Mio_LibraryReadInv(pLib_00);
    }
    else {
      local_70 = Mio_LibraryReadBuf(pLib_00);
    }
    iVar1 = Mio_GateReadValue(local_70);
    Vec_IntPush(vGates,iVar1);
    p_00 = Vec_WecPushLevel(vFanins);
    Vec_IntPush(p_00,*pFanins);
    return 1;
  }
  __assert_fail("nFanins == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                ,0x2b6,
                "int Sfm_LibImplementSimple(Sfm_Lib_t *, word *, int *, int, Vec_Int_t *, Vec_Wec_t *)"
               );
}

Assistant:

int Sfm_LibImplementSimple( Sfm_Lib_t * p, word * pTruth, int * pFanins, int nFanins, Vec_Int_t * vGates, Vec_Wec_t * vFanins )
{
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Mio_Gate_t * pGate;
    Vec_Int_t * vLevel;
    if ( Abc_TtIsConst0(pTruth, p->nWords) || Abc_TtIsConst1(pTruth, p->nWords) )
    {
        assert( nFanins == 0 );
        pGate = Abc_TtIsConst1(pTruth, p->nWords) ? Mio_LibraryReadConst1(pLib) : Mio_LibraryReadConst0(pLib);
        Vec_IntPush( vGates, Mio_GateReadValue(pGate) );
        vLevel = Vec_WecPushLevel( vFanins );
        return 1;
    }
    if ( Abc_TtEqual(pTruth, s_Truth8[0], p->nWords) || Abc_TtOpposite(pTruth, s_Truth8[0], p->nWords) )
    {
        assert( nFanins == 1 );
        pGate = Abc_TtEqual(pTruth, s_Truth8[0], p->nWords) ? Mio_LibraryReadBuf(pLib) : Mio_LibraryReadInv(pLib);
        Vec_IntPush( vGates, Mio_GateReadValue(pGate) );
        vLevel = Vec_WecPushLevel( vFanins );
        Vec_IntPush( vLevel, pFanins[0] );
        return 1;
    }
    assert( 0 );
    return -1;
}